

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

llama_token
common_sampler_sample(common_sampler *gsmpl,llama_context *ctx,int idx,bool grammar_first)

{
  byte in_CL;
  int in_EDX;
  llama_context *in_RSI;
  common_sampler *in_RDI;
  bool is_valid;
  llama_token_data_array single_token_data_array;
  llama_token_data single_token_data;
  llama_token id;
  llama_token_data_array *cur_p;
  llama_sampler **chain;
  llama_sampler **grmr;
  llama_token *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50;
  llama_token local_48 [4];
  llama_token_data_array *local_38;
  llama_sampler **local_30;
  llama_sampler **local_28;
  byte local_1d;
  llama_token local_4;
  
  local_1d = in_CL & 1;
  common_sampler::set_logits(in_RDI,in_RSI,in_EDX);
  local_28 = &in_RDI->grmr;
  local_30 = &in_RDI->chain;
  local_38 = &in_RDI->cur_p;
  if ((local_1d & 1) != 0) {
    llama_sampler_apply(*local_28,local_38);
  }
  llama_sampler_apply(*local_30,local_38);
  if (local_38->selected == -1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0x162,"GGML_ASSERT(%s) failed",
               "cur_p.selected != -1 && \"no selected token during sampling - check your sampling configuration\""
              );
  }
  local_48[0] = local_38->data[local_38->selected].id;
  local_4 = local_48[0];
  if ((local_1d & 1) == 0) {
    local_48[1] = 0x3f800000;
    local_48[2] = 0;
    local_68 = local_48;
    local_60 = 1;
    local_58 = 0xffffffffffffffff;
    local_50 = 0;
    local_48[3] = local_48[0];
    llama_sampler_apply(*local_28,&local_68);
    if ((float)local_68[1] == -INFINITY) {
      common_sampler::set_logits(in_RDI,in_RSI,in_EDX);
      llama_sampler_apply(*local_28,local_38);
      llama_sampler_apply(*local_30,local_38);
      if (local_38->selected == -1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,0x17e,"GGML_ASSERT(%s) failed",
                   "cur_p.selected != -1 && \"no selected token during re-sampling - check your sampling configuration\""
                  );
      }
      local_4 = local_38->data[local_38->selected].id;
    }
    else {
      local_4 = local_48[3];
    }
  }
  return local_4;
}

Assistant:

llama_token common_sampler_sample(struct common_sampler * gsmpl, struct llama_context * ctx, int idx, bool grammar_first) {
    gsmpl->set_logits(ctx, idx);

    auto & grmr  = gsmpl->grmr;
    auto & chain = gsmpl->chain;
    auto & cur_p = gsmpl->cur_p; // initialized by set_logits

    if (grammar_first) {
        llama_sampler_apply(grmr, &cur_p);
    }

    llama_sampler_apply(chain, &cur_p);

    GGML_ASSERT(cur_p.selected != -1 && "no selected token during sampling - check your sampling configuration");

    const llama_token id = cur_p.data[cur_p.selected].id;

    if (grammar_first) {
        return id;
    }

    // check if it the sampled token fits the grammar
    {
        llama_token_data       single_token_data       = { id, 1.0f, 0.0f };
        llama_token_data_array single_token_data_array = { &single_token_data, 1, -1, false };

        llama_sampler_apply(grmr, &single_token_data_array);

        const bool is_valid = single_token_data_array.data[0].logit != -INFINITY;
        if (is_valid) {
            return id;
        }
    }

    // resampling:
    // if the token is not valid, sample again, but first apply the grammar sampler and then the sampling chain
    gsmpl->set_logits(ctx, idx);

    llama_sampler_apply(grmr,  &cur_p);
    llama_sampler_apply(chain, &cur_p);

    GGML_ASSERT(cur_p.selected != -1 && "no selected token during re-sampling - check your sampling configuration");

    return cur_p.data[cur_p.selected].id;
}